

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysisFI.h
# Opt level: O0

void __thiscall dg::pta::PointerAnalysisFI::~PointerAnalysisFI(PointerAnalysisFI *this)

{
  PointerAnalysisFI *in_RDI;
  
  ~PointerAnalysisFI(in_RDI);
  operator_delete(in_RDI,0xa0);
  return;
}

Assistant:

void preprocessGEPs() {
        // if a node is in a loop (a scc that has more than one node),
        // then every GEP that is also stored to the same memory afterwards
        // in the loop will end up with Offset::UNKNOWN after some
        // number of iterations (in FI analysis), so we can do that right now
        // and save iterations

        assert(getPG() && "Must have PG");
        for (const auto &sg : getPG()->getSubgraphs()) {
            for (const auto &loop : sg->getLoops()) {
                for (PSNode *n : loop) {
                    if (PSNodeGep *gep = PSNodeGep::get(n))
                        gep->setOffset(Offset::UNKNOWN);
                }
            }
        }
    }